

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::
emplaceRealloc<slang::parsing::TriviaKind,std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<slang::parsing::Trivia> *this,pointer pos,TriviaKind *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  ulong uVar1;
  undefined8 *puVar2;
  string_view rawText;
  undefined8 uVar3;
  Trivia *__cur_1;
  pointer pTVar4;
  Trivia *this_00;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  long lVar8;
  EVP_PKEY_CTX *ctx;
  ulong uVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pTVar4 = (pointer)operator_new(uVar9 << 4);
  this_00 = (Trivia *)((long)pTVar4 + lVar8);
  ctx = (EVP_PKEY_CTX *)(ulong)*args;
  rawText._M_len = args_1->_M_len;
  rawText._M_str = args_1->_M_str;
  parsing::Trivia::Trivia(this_00,*args,rawText);
  pTVar7 = this->data_;
  pTVar5 = pTVar7 + this->len;
  pTVar6 = pTVar4;
  if (pTVar5 == pos) {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      uVar3 = *(undefined8 *)((long)&pTVar7->field_0 + 8);
      (pTVar6->field_0).rawText.ptr = (pTVar7->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar6->field_0 + 8) = uVar3;
      pTVar6 = pTVar6 + 1;
    }
  }
  else {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      uVar3 = *(undefined8 *)((long)&pTVar7->field_0 + 8);
      (pTVar6->field_0).rawText.ptr = (pTVar7->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar6->field_0 + 8) = uVar3;
      pTVar6 = pTVar6 + 1;
    }
    puVar2 = (undefined8 *)((long)pTVar4 + lVar8);
    for (; pos != pTVar5; pos = pos + 1) {
      uVar3 = *(undefined8 *)((long)&pos->field_0 + 8);
      puVar2[2] = (pos->field_0).rawText.ptr;
      puVar2[3] = uVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar9;
  this->data_ = pTVar4;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}